

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall
kratos::SensitivityVisitor::visit(SensitivityVisitor *this,SequentialStmtBlock *stmt)

{
  VarType VVar1;
  pointer pEVar2;
  element_type *peVar3;
  StmtException *pSVar4;
  PortType type;
  element_type *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer pEVar5;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  SequentialStmtBlock *local_e8;
  element_type *local_e0;
  undefined1 auStack_d8 [8];
  shared_ptr<kratos::VarCasted> var_casted;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  shared_ptr<kratos::Port> port;
  allocator_type local_31;
  
  pEVar5 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar5 != pEVar2) {
    do {
      peVar3 = (element_type *)pEVar5->var;
      VVar1 = (peVar3->super_Var).type_;
      if (VVar1 == BaseCasted) {
        Var::as<kratos::VarCasted>((Var *)auStack_d8);
        this_00 = var_casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if (((ulong)*(pointer *)((long)auStack_d8 + 0x280) & 0xfffffffe) != 2) {
          pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
          (*(peVar3->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_b8,peVar3);
          port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_dataplus._M_p;
          format_str.size_ = 0xd;
          format_str.data_ = (char *)0x55;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)
                   &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_98,
                     (detail *)
                     "Only Clock and AsyncReset allowed in sensitivity list. Please use cast() to cast {0}}"
                     ,format_str,args);
          __l._M_len = 2;
          __l._M_array = (iterator)local_78;
          local_78 = (undefined1  [8])stmt;
          port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)peVar3;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                     &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     __l,(allocator_type *)&local_e8);
          StmtException::StmtException
                    (pSVar4,&local_98,
                     (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                     &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
          ;
          __cxa_throw(pSVar4,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        if (VVar1 != PortIO) {
          pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
          (*(peVar3->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_b8,peVar3);
          port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_dataplus._M_p;
          format_str_00.size_ = 0xd;
          format_str_00.data_ = (char *)0x4f;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)
                   &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_98,
                     (detail *)
                     "Only variable type of Clock and AsyncReset allowed in sensitivity list, got {0}"
                     ,format_str_00,args_00);
          __l_00._M_len = 2;
          __l_00._M_array = (iterator)auStack_d8;
          auStack_d8 = (undefined1  [8])stmt;
          var_casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar3;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                     &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     __l_00,(allocator_type *)local_78);
          StmtException::StmtException
                    (pSVar4,&local_98,
                     (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                     &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
          ;
          __cxa_throw(pSVar4,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
        Var::as<kratos::Port>((Var *)local_78);
        this_00 = (element_type *)
                  port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (1 < *(int *)((long)&((__shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2> *)
                                &((IRNode *)((long)local_78 + 0x270))->_vptr_IRNode)->_M_ptr + 4) -
                1U) {
          pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
          (*(peVar3->super_Var).super_IRNode._vptr_IRNode[0x1f])
                    (&port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     peVar3);
          port_type_to_str_abi_cxx11_
                    ((string *)auStack_d8,
                     (kratos *)
                     (ulong)*(uint *)((long)&((__shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>
                                               *)&((IRNode *)((long)local_78 + 0x270))->_vptr_IRNode
                                             )->_M_ptr + 4),type);
          local_98._M_dataplus._M_p =
               (pointer)port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          local_98.field_2._M_allocated_capacity = (size_type)auStack_d8;
          local_98.field_2._8_8_ =
               var_casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          format_str_01.size_ = 0xdd;
          format_str_01.data_ = (char *)0x41;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_98;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_b8,
                     (detail *)"Only Clock and AsyncReset allowed in sensitivity list. {0} is {1}",
                     format_str_01,args_01);
          __l_01._M_len = 2;
          __l_01._M_array = (iterator)&local_e8;
          local_e8 = stmt;
          local_e0 = peVar3;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)&local_98,__l_01
                     ,&local_31);
          StmtException::StmtException
                    (pSVar4,&local_b8,
                     (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)&local_98);
          __cxa_throw(pSVar4,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      if (this_00 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      pEVar5 = pEVar5 + 1;
    } while (pEVar5 != pEVar2);
  }
  return;
}

Assistant:

void visit(SequentialStmtBlock* stmt) override {
        auto const& sensitivity_list = stmt->get_event_controls();
        for (auto const& iter : sensitivity_list) {
            auto* var = iter.var;
            // check type
            if (var->type() == VarType::PortIO) {
                // it's a port
                auto port = var->as<Port>();
                if (port->port_type() != PortType::Clock &&
                    port->port_type() != PortType::AsyncReset) {
                    // only clock and async reset allowed
                    throw StmtException(
                        ::format("Only Clock and AsyncReset allowed in "
                                 "sensitivity list. {0} is {1}",
                                 var->to_string(), port_type_to_str(port->port_type())),
                        {stmt, var});
                }
            } else if (var->type() == VarType::BaseCasted) {
                auto var_casted = var->as<VarCasted>();
                if (var_casted->cast_type() != VarCastType::Clock &&
                    var_casted->cast_type() != VarCastType::AsyncReset) {
                    throw StmtException(::format("Only Clock and AsyncReset allowed in "
                                                 "sensitivity list. Please use cast() to cast {0}}",
                                                 var->to_string()),
                                        {stmt, var});
                }
            } else {
                throw StmtException(::format("Only variable type of Clock and "
                                             "AsyncReset allowed in sensitivity list, got {0}",
                                             var->to_string()),
                                    {stmt, var});
            }
        }
    }